

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O1

REF_STATUS
ref_swap_node23(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT *node2,REF_INT *node3)

{
  REF_CELL pRVar1;
  REF_NODE ref_node;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  REF_GRID ref_grid_00;
  REF_INT cell_to_swap [2];
  REF_INT ncell;
  REF_INT nodes [27];
  REF_DBL normal [3];
  uint local_d8;
  uint local_d4;
  REF_CELL local_d0;
  uint local_c8;
  int local_c4;
  REF_GRID local_c0;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  REF_DBL local_48;
  undefined8 local_40;
  
  pRVar1 = ref_grid->cell[3];
  *node2 = -1;
  *node3 = -1;
  uVar2 = ref_cell_list_with2(pRVar1,node0,node1,2,&local_c4,(REF_INT *)&local_d8);
  if (uVar2 == 0) {
    local_d0 = pRVar1;
    local_c0 = ref_grid;
    if ((long)local_c4 != 2) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0xfe,
             "ref_swap_node23","there should be two triangles for manifold",2,(long)local_c4);
      uVar2 = 1;
    }
    uVar3 = uVar2;
    if (local_c4 == 2) {
      uVar3 = ref_cell_nodes(local_d0,local_d8,(REF_INT *)&local_b8);
      if (uVar3 == 0) {
        uVar3 = local_b8 ^ node0;
        uVar5 = local_b4 ^ node1;
        if (uVar3 == 0 && uVar5 == 0) {
          *node2 = local_b0;
        }
        uVar6 = local_b0 ^ node1;
        uVar7 = local_b0 ^ node0;
        uVar8 = local_b8 ^ node1;
        if ((local_b4 ^ node0) == 0 && uVar6 == 0 || uVar8 == 0 && uVar7 == 0) {
          uVar4 = local_b8;
          if (uVar8 == 0 && uVar7 == 0) {
            uVar4 = local_b4;
          }
          *node2 = uVar4;
        }
        if (((uVar3 == 0 && uVar6 == 0) || (uVar8 == 0 && (local_b4 ^ node0) == 0)) ||
           (uVar5 == 0 && uVar7 == 0)) {
          uVar8 = local_b0;
          if (uVar5 == 0 && uVar7 == 0) {
            uVar8 = local_b8;
          }
          if (uVar3 == 0 && uVar6 == 0) {
            uVar8 = local_b4;
          }
          *node3 = uVar8;
        }
        local_c8 = uVar2;
        uVar3 = ref_cell_nodes(local_d0,local_d4,(REF_INT *)&local_b8);
        ref_grid_00 = local_c0;
        if (uVar3 == 0) {
          uVar2 = local_b8 ^ node0;
          uVar3 = local_b4 ^ node1;
          if (uVar2 == 0 && uVar3 == 0) {
            *node2 = local_b0;
          }
          uVar5 = local_b0 ^ node1;
          uVar6 = local_b0 ^ node0;
          uVar7 = local_b8 ^ node1;
          if ((local_b4 ^ node0) == 0 && uVar5 == 0 || uVar7 == 0 && uVar6 == 0) {
            uVar8 = local_b8;
            if (uVar7 == 0 && uVar6 == 0) {
              uVar8 = local_b4;
            }
            *node2 = uVar8;
          }
          if (((uVar2 == 0 && uVar5 == 0) || (uVar7 == 0 && (local_b4 ^ node0) == 0)) ||
             (uVar3 == 0 && uVar6 == 0)) {
            uVar7 = local_b0;
            if (uVar3 == 0 && uVar6 == 0) {
              uVar7 = local_b8;
            }
            if (uVar2 == 0 && uVar5 == 0) {
              uVar7 = local_b4;
            }
            *node3 = uVar7;
          }
          if (*node2 == -1) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                   0x124,"ref_swap_node23","node2 not found");
            ref_node = ref_grid_00->node;
            ref_node_location(ref_node,node0);
            ref_node_location(ref_grid_00->node,node1);
            printf("node2 %d node3 %d\n",(ulong)(uint)*node2,(ulong)(uint)*node3);
            pRVar1 = local_d0;
            ref_cell_nodes(local_d0,local_d8,(REF_INT *)&local_b8);
            ref_node_tri_normal(ref_node,(REF_INT *)&local_b8,&local_48);
            printf("cell %d node %d %d %d %d %f\n",local_40,(ulong)local_d8,(ulong)local_b8,
                   (ulong)local_b4,(ulong)local_b0,(ulong)local_ac);
            ref_node_location(ref_grid_00->node,local_b8);
            ref_node_location(ref_grid_00->node,local_b4);
            ref_node_location(ref_grid_00->node,local_b0);
            ref_cell_nodes(pRVar1,local_d4,(REF_INT *)&local_b8);
            ref_node_tri_normal(ref_node,(REF_INT *)&local_b8,&local_48);
            printf("cell %d node %d %d %d %d %f\n",local_40,(ulong)local_d4,(ulong)local_b8,
                   (ulong)local_b4,(ulong)local_b0,(ulong)local_ac);
          }
          else {
            if (*node3 != -1) {
              return 0;
            }
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                   0x136,"ref_swap_node23","node3 not found");
            ref_grid_00 = local_c0;
            ref_node_location(local_c0->node,node0);
            ref_node_location(ref_grid_00->node,node1);
            printf("node2 %d node3 %d\n",(ulong)(uint)*node2,(ulong)(uint)*node3);
            pRVar1 = local_d0;
            ref_cell_nodes(local_d0,local_d8,(REF_INT *)&local_b8);
            printf("cell %d node %d %d %d %d\n",(ulong)local_d8,(ulong)local_b8,(ulong)local_b4,
                   (ulong)local_b0,(ulong)local_ac);
            ref_node_location(ref_grid_00->node,local_b8);
            ref_node_location(ref_grid_00->node,local_b4);
            ref_node_location(ref_grid_00->node,local_b0);
            ref_cell_nodes(pRVar1,local_d4,(REF_INT *)&local_b8);
            printf("cell %d node %d %d %d %d\n",(ulong)local_d4,(ulong)local_b8,(ulong)local_b4,
                   (ulong)local_b0,(ulong)local_ac);
          }
          ref_node_location(ref_grid_00->node,local_b8);
          ref_node_location(ref_grid_00->node,local_b4);
          ref_node_location(ref_grid_00->node,local_b0);
          ref_export_by_extension(ref_grid_00,"ref_swap_node23.tec");
          uVar3 = 1;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                 0x107,"ref_swap_node23",(ulong)uVar3,"nodes tri0");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
               0x100,"ref_swap_node23",(ulong)uVar3,"nodes tri0");
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0xfd,
           "ref_swap_node23",(ulong)uVar2,"more then two");
    uVar3 = uVar2;
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_swap_node23(REF_GRID ref_grid, REF_INT node0,
                                   REF_INT node1, REF_INT *node2,
                                   REF_INT *node3) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT ncell, cell_to_swap[2];
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  *node2 = REF_EMPTY;
  *node3 = REF_EMPTY;
  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cell_to_swap),
      "more then two");
  REIS(2, ncell, "there should be two triangles for manifold");

  RSS(ref_cell_nodes(ref_cell, cell_to_swap[0], nodes), "nodes tri0");
  if (node0 == nodes[0] && node1 == nodes[1]) *node2 = nodes[2];
  if (node0 == nodes[1] && node1 == nodes[2]) *node2 = nodes[0];
  if (node0 == nodes[2] && node1 == nodes[0]) *node2 = nodes[1];
  if (node1 == nodes[0] && node0 == nodes[1]) *node3 = nodes[2];
  if (node1 == nodes[1] && node0 == nodes[2]) *node3 = nodes[0];
  if (node1 == nodes[2] && node0 == nodes[0]) *node3 = nodes[1];
  RSS(ref_cell_nodes(ref_cell, cell_to_swap[1], nodes), "nodes tri0");
  if (node0 == nodes[0] && node1 == nodes[1]) *node2 = nodes[2];
  if (node0 == nodes[1] && node1 == nodes[2]) *node2 = nodes[0];
  if (node0 == nodes[2] && node1 == nodes[0]) *node2 = nodes[1];
  if (node1 == nodes[0] && node0 == nodes[1]) *node3 = nodes[2];
  if (node1 == nodes[1] && node0 == nodes[2]) *node3 = nodes[0];
  if (node1 == nodes[2] && node0 == nodes[0]) *node3 = nodes[1];

  RUB(REF_EMPTY, *node2, "node2 not found", {
    REF_DBL normal[3];
    REF_NODE ref_node = ref_grid_node(ref_grid);
    ref_node_location(ref_grid_node(ref_grid), node0);
    ref_node_location(ref_grid_node(ref_grid), node1);
    printf("node2 %d node3 %d\n", *node2, *node3);
    ref_cell_nodes(ref_cell, cell_to_swap[0], nodes);
    ref_node_tri_normal(ref_node, nodes, normal);
    printf("cell %d node %d %d %d %d %f\n", cell_to_swap[0], nodes[0], nodes[1],
           nodes[2], nodes[3], normal[1]);
    ref_node_location(ref_grid_node(ref_grid), nodes[0]);
    ref_node_location(ref_grid_node(ref_grid), nodes[1]);
    ref_node_location(ref_grid_node(ref_grid), nodes[2]);
    ref_cell_nodes(ref_cell, cell_to_swap[1], nodes);
    ref_node_tri_normal(ref_node, nodes, normal);
    printf("cell %d node %d %d %d %d %f\n", cell_to_swap[1], nodes[0], nodes[1],
           nodes[2], nodes[3], normal[1]);
    ref_node_location(ref_grid_node(ref_grid), nodes[0]);
    ref_node_location(ref_grid_node(ref_grid), nodes[1]);
    ref_node_location(ref_grid_node(ref_grid), nodes[2]);
    ref_export_by_extension(ref_grid, "ref_swap_node23.tec");
  });
  RUB(REF_EMPTY, *node3, "node3 not found", {
    ref_node_location(ref_grid_node(ref_grid), node0);
    ref_node_location(ref_grid_node(ref_grid), node1);
    printf("node2 %d node3 %d\n", *node2, *node3);
    ref_cell_nodes(ref_cell, cell_to_swap[0], nodes);
    printf("cell %d node %d %d %d %d\n", cell_to_swap[0], nodes[0], nodes[1],
           nodes[2], nodes[3]);
    ref_node_location(ref_grid_node(ref_grid), nodes[0]);
    ref_node_location(ref_grid_node(ref_grid), nodes[1]);
    ref_node_location(ref_grid_node(ref_grid), nodes[2]);
    ref_cell_nodes(ref_cell, cell_to_swap[1], nodes);
    printf("cell %d node %d %d %d %d\n", cell_to_swap[1], nodes[0], nodes[1],
           nodes[2], nodes[3]);
    ref_node_location(ref_grid_node(ref_grid), nodes[0]);
    ref_node_location(ref_grid_node(ref_grid), nodes[1]);
    ref_node_location(ref_grid_node(ref_grid), nodes[2]);
    ref_export_by_extension(ref_grid, "ref_swap_node23.tec");
  });

  return REF_SUCCESS;
}